

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_flow_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_t gVar1;
  gnode_t *pgVar2;
  gnode_t *stmt1_00;
  gnode_t *local_a8;
  undefined1 local_88 [8];
  gtoken_s end_token;
  gnode_t *stmt2;
  gnode_t *stmt1;
  gnode_t *cond;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&cond,lexer_00);
  if ((token.value._4_4_ != TOK_KEY_IF) && (token.value._4_4_ != TOK_KEY_SWITCH)) {
    __assert_fail("(type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x87a,"gnode_t *parse_flow_statement(gravity_parser_t *)");
  }
  parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  pgVar2 = parse_expression(parser);
  parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  stmt1_00 = parse_statement(parser);
  end_token.value = (char *)0x0;
  if (token.value._4_4_ == TOK_KEY_IF) {
    gVar1 = gravity_lexer_peek(lexer_00);
    if (gVar1 == TOK_KEY_ELSE) {
      gravity_lexer_next(lexer_00);
      end_token.value = (char *)parse_statement(parser);
    }
  }
  gravity_lexer_token((gtoken_s *)local_88,lexer_00);
  if (parser->declarations->n == 0) {
    local_a8 = (gnode_t *)0x0;
  }
  else {
    local_a8 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.position = token.lineno;
  token_00.colno = token.type;
  token_00._0_8_ = cond;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgVar2 = gnode_flow_stat_create
                     (token_00,pgVar2,stmt1_00,(gnode_t *)end_token.value,local_a8,
                      (end_token.lineno + end_token.position) - token.lineno);
  return pgVar2;
}

Assistant:

static gnode_t *parse_flow_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_flow_statement");

    // 'if' '(' expression ')' statement ('else' statement)?
    // 'switch' '(' expression ')' statement

    DECLARE_LEXER;
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert((type == TOK_KEY_IF) || (type == TOK_KEY_SWITCH));

    // check required TOK_OP_OPEN_PARENTHESIS
    parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse common expression
    gnode_t *cond = parse_expression(parser);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    // parse common statement
    gnode_t *stmt1 = parse_statement(parser);
    gnode_t *stmt2 = NULL;
    if ((type == TOK_KEY_IF) && (gravity_lexer_peek(lexer) == TOK_KEY_ELSE)) {
        gravity_lexer_next(lexer); // consume TOK_KEY_ELSE
        stmt2 = parse_statement(parser);
    }

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);
	
	return gnode_flow_stat_create(token, cond, stmt1, stmt2, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}